

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_algorithm.hpp
# Opt level: O2

void __thiscall
ranges::detail::sift_down_n_fn::operator()
          (sift_down_n_fn *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          iter_difference_t<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_> len,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> start,
          reference_wrapper<ranges::less> pred,reference_wrapper<ranges::identity> proj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (1 < len) {
    uVar7 = len - 2U >> 1;
    if ((long)start._M_current - (long)first._M_current >> 2 <= (long)uVar7) {
      uVar10 = (long)start._M_current - (long)first._M_current >> 1;
      piVar9 = first._M_current + uVar10 + 1;
      uVar11 = uVar10 | 1;
      if ((long)(uVar10 + 2) < len) {
        iVar2 = *piVar9;
        iVar3 = first._M_current[uVar10 + 2];
        iVar5 = iVar3;
        if (iVar3 < iVar2) {
          iVar5 = iVar2;
        }
        if (iVar2 < iVar3) {
          piVar9 = first._M_current + uVar10 + 2;
          uVar11 = uVar10 + 2;
        }
      }
      else {
        iVar5 = *piVar9;
      }
      iVar2 = *start._M_current;
      if (iVar2 <= iVar5) {
        do {
          piVar8 = piVar9;
          *start._M_current = iVar5;
          if ((long)uVar7 < (long)uVar11) break;
          uVar10 = uVar11 * 2 + 1;
          piVar9 = first._M_current + uVar11 * 2 + 1;
          uVar1 = uVar11 * 2 + 2;
          if ((long)uVar1 < len) {
            lVar6 = uVar11 * 2;
            iVar3 = *piVar9;
            iVar4 = first._M_current[uVar11 * 2 + 2];
            iVar5 = iVar4;
            if (iVar4 < iVar3) {
              iVar5 = iVar3;
            }
            uVar11 = uVar10;
            if (iVar3 < iVar4) {
              piVar9 = first._M_current + lVar6 + 2;
              uVar11 = uVar1;
            }
          }
          else {
            iVar5 = *piVar9;
            uVar11 = uVar10;
          }
          start._M_current = piVar8;
        } while (iVar2 <= iVar5);
        *piVar8 = iVar2;
      }
    }
  }
  return;
}

Assistant:

void operator()(I first, iter_difference_t<I> len, I start, C pred = C{},
                            P proj = P{}) const
            {
                // left-child of start is at 2 * start + 1
                // right-child of start is at 2 * start + 2
                auto child = start - first;

                if(len < 2 || (len - 2) / 2 < child)
                    return;

                child = 2 * child + 1;
                I child_i = first + child;

                if((child + 1) < len &&
                   invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                {
                    // right-child exists and is greater than left-child
                    ++child_i;
                    ++child;
                }

                // check if we are in heap-order
                if(invoke(pred, invoke(proj, *child_i), invoke(proj, *start)))
                    // we are, start is larger than it's largest child
                    return;

                iter_value_t<I> top = iter_move(start);
                do
                {
                    // we are not in heap-order, swap the parent with it's largest child
                    *start = iter_move(child_i);
                    start = child_i;

                    if((len - 2) / 2 < child)
                        break;

                    // recompute the child based off of the updated parent
                    child = 2 * child + 1;
                    child_i = first + child;

                    if((child + 1) < len &&
                       invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                    {
                        // right-child exists and is greater than left-child
                        ++child_i;
                        ++child;
                    }

                    // check if we are in heap-order
                } while(!invoke(pred, invoke(proj, *child_i), invoke(proj, top)));
                *start = std::move(top);
            }